

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::UpsampleLayerParams::Clear(UpsampleLayerParams *this)

{
  UpsampleLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->scalingfactor_);
  google::protobuf::RepeatedField<float>::Clear(&this->fractionalscalingfactor_);
  memset(&this->mode_,0,8);
  return;
}

Assistant:

void UpsampleLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UpsampleLayerParams)
  scalingfactor_.Clear();
  fractionalscalingfactor_.Clear();
  ::memset(&mode_, 0, reinterpret_cast<char*>(&linearupsamplemode_) -
    reinterpret_cast<char*>(&mode_) + sizeof(linearupsamplemode_));
}